

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O0

NFA * __thiscall NFA::NFA_concatenate(NFA *this,NFA *a,NFA *b,int type)

{
  NFA *this_00;
  Node *this_01;
  Node *this_02;
  mapped_type *pmVar1;
  key_type local_3f [15];
  NFA *local_30;
  NFA *result;
  NFA *pNStack_20;
  int type_local;
  NFA *b_local;
  NFA *a_local;
  NFA *this_local;
  
  result._4_4_ = type;
  pNStack_20 = b;
  b_local = a;
  a_local = this;
  this_00 = (NFA *)operator_new(0x10);
  this_01 = (Node *)operator_new(0x40);
  Node::Node(this_01,result._4_4_);
  this_02 = (Node *)operator_new(0x40);
  Node::Node(this_02,result._4_4_);
  NFA(this_00,this_01,this_02);
  local_3f[2] = 0;
  local_30 = this_00;
  pmVar1 = std::
           map<char,_std::vector<Node_*,_std::allocator<Node_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<Node_*,_std::allocator<Node_*>_>_>_>_>
           ::operator[](&this_00->start->adjacent,local_3f + 2);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(pmVar1,&b_local->start);
  local_3f[1] = 0;
  pmVar1 = std::
           map<char,_std::vector<Node_*,_std::allocator<Node_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<Node_*,_std::allocator<Node_*>_>_>_>_>
           ::operator[](&pNStack_20->end->adjacent,local_3f + 1);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(pmVar1,&local_30->end);
  local_3f[0] = '\0';
  pmVar1 = std::
           map<char,_std::vector<Node_*,_std::allocator<Node_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::vector<Node_*,_std::allocator<Node_*>_>_>_>_>
           ::operator[](&b_local->end->adjacent,local_3f);
  std::vector<Node_*,_std::allocator<Node_*>_>::push_back(pmVar1,&pNStack_20->start);
  b_local->end->isAccepting = false;
  pNStack_20->end->isAccepting = false;
  local_30->end->isAccepting = true;
  return local_30;
}

Assistant:

NFA *NFA::NFA_concatenate(NFA *a, NFA *b, int type) {
    NFA *result = new NFA(new Node(type), new Node(type));
    result->start->adjacent['\0'].push_back(a->start);
    b->end->adjacent['\0'].push_back(result->end);
    a->end->adjacent['\0'].push_back(b->start);
    a->end->isAccepting = false;
    b->end->isAccepting = false;
    result->end->isAccepting = true;
    return result;
}